

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# polymer.cpp
# Opt level: O2

void __thiscall Polymer::Unlink(Polymer *this)

{
  element_type *peVar1;
  pointer pIVar2;
  SpeciesTracker *this_00;
  pointer pIVar3;
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  results;
  intervalVector local_58;
  __shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2> local_40 [8];
  __shared_count<(__gnu_cxx::_Lock_policy)2> local_38;
  
  local_58.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  local_58.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_start = (pointer)0x0;
  local_58.
  super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ._M_impl.super__Vector_impl_data._M_finish = (pointer)0x0;
  IntervalTree<std::shared_ptr<BindingSite>,_unsigned_long>::findOverlapping
            (&this->binding_sites_,(long)this->start_,(long)this->stop_,&local_58);
  pIVar2 = local_58.
           super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
           ._M_impl.super__Vector_impl_data._M_finish;
  for (pIVar3 = local_58.
                super__Vector_base<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
                ._M_impl.super__Vector_impl_data._M_start; pIVar3 != pIVar2; pIVar3 = pIVar3 + 1) {
    this_00 = SpeciesTracker::Instance();
    peVar1 = (pIVar3->value).super___shared_ptr<BindingSite,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    std::__shared_ptr<Polymer,(__gnu_cxx::_Lock_policy)2>::__shared_ptr<Polymer,void>
              (local_40,(__weak_ptr<Polymer,_(__gnu_cxx::_Lock_policy)2> *)
                        &this->super_enable_shared_from_this<Polymer>);
    SpeciesTracker::Remove(this_00,&(peVar1->super_FixedElement).name_,(Ptr *)local_40);
    std::__shared_count<(__gnu_cxx::_Lock_policy)2>::~__shared_count(&local_38);
  }
  std::
  vector<Interval<std::shared_ptr<BindingSite>,_unsigned_long>,_std::allocator<Interval<std::shared_ptr<BindingSite>,_unsigned_long>_>_>
  ::~vector(&local_58);
  return;
}

Assistant:

void Polymer::Unlink() {
  // Remove all pointers to polymer from promoter-polymer map
  std::vector<Interval<BindingSite::Ptr>> results;
  binding_sites_.findOverlapping(start_, stop_, results);
  for (auto &interval : results) {
    // std::cout << "Destroying " + interval.value->name() + " \n" << std::endl;
    SpeciesTracker::Instance().Remove(interval.value->name(),
                                      shared_from_this());
  }
}